

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

MIR_reg_t get_reload_hreg(gen_ctx_t gen_ctx,MIR_reg_t var,MIR_reg_t type,int out_p)

{
  int iVar1;
  ra_ctx *prVar2;
  uint uVar3;
  int iVar4;
  MIR_reg_t MVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  
  prVar2 = gen_ctx->ra_ctx;
  lVar10 = 0x1e8;
  uVar6 = (ulong)(out_p != 0);
  if (out_p == 0) {
    lVar10 = 0x188;
  }
  iVar1 = *(int *)((long)prVar2->in_reloads + uVar6 * 4 + -8);
  lVar9 = (long)iVar1;
  if (lVar9 < 1) {
    uVar12 = 0;
  }
  else {
    uVar8 = type - 8;
    lVar11 = 0;
    uVar12 = 0;
    do {
      if ((var != 0xffffffff) &&
         (*(MIR_reg_t *)((long)prVar2->lr_gap_bitmaps + lVar11 + lVar10 + -0x3c) == var)) {
        return *(MIR_reg_t *)((long)prVar2->lr_gap_bitmaps + lVar11 + lVar10 + -0x38);
      }
      iVar4 = *(int *)((long)prVar2->lr_gap_bitmaps + lVar11 + lVar10 + -0x38);
      if (uVar12 == 0) {
        iVar7 = 10;
        if (uVar8 < 3) {
          iVar7 = *(int *)(&DAT_001b1a90 + (ulong)uVar8 * 4);
        }
        uVar3 = 1;
        if (iVar4 != iVar7) goto LAB_00170398;
      }
      else {
LAB_00170398:
        iVar7 = 0xb;
        if (uVar8 < 3) {
          iVar7 = *(int *)(&DAT_001b1a9c + (ulong)uVar8 * 4);
        }
        uVar3 = uVar12;
        if (iVar4 == iVar7) {
          uVar3 = 2;
        }
      }
      uVar12 = uVar3;
      lVar11 = lVar11 + 0xc;
    } while (lVar9 * 0xc != lVar11);
    if (1 < uVar12) {
      __assert_fail("rld_num <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
  }
  if (type == 10) {
    MVar5 = 0xffffffff;
  }
  else {
    if ((type == 9) || (type == 8)) {
      iVar4 = 0x19;
    }
    else {
      iVar4 = 0xb;
    }
    MVar5 = iVar4 - (uint)(uVar12 == 0);
  }
  *(int *)((long)prVar2->in_reloads + uVar6 * 4 + -8) = iVar1 + 1;
  if (iVar1 < 8) {
    *(MIR_reg_t *)((long)prVar2->lr_gap_bitmaps + lVar9 * 0xc + lVar10 + -0x3c) = var;
    *(MIR_reg_t *)((long)prVar2->lr_gap_bitmaps + lVar9 * 0xc + lVar10 + -0x40) = type;
    *(MIR_reg_t *)((long)prVar2->lr_gap_bitmaps + lVar9 * 0xc + lVar10 + -0x38) = MVar5;
    return MVar5;
  }
  __assert_fail("rld_num < (2 * 4)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
}

Assistant:

static MIR_reg_t get_reload_hreg (gen_ctx_t gen_ctx, MIR_reg_t var, MIR_reg_t type, int out_p) {
  MIR_reg_t hr;
  insn_reload_t *reloads = out_p ? out_reloads : in_reloads;
  int rld_num = 0, *reloads_num = out_p ? &out_reloads_num : &in_reloads_num;

  for (int i = 0; i < *reloads_num; i++) {
    if (var != MIR_NON_VAR && reloads[i].var == var) return reloads[i].hreg;
    if (rld_num == 0 && reloads[i].hreg == get_temp_hard_reg (type, TRUE))
      rld_num = 1;
    else if (reloads[i].hreg == get_temp_hard_reg (type, FALSE))
      rld_num = 2;
  }
  gen_assert (rld_num <= 1);
  hr = get_temp_hard_reg (type, rld_num == 0);
  rld_num = (*reloads_num)++;
  gen_assert (rld_num < MAX_INSN_RELOADS);
  reloads[rld_num].var = var;
  reloads[rld_num].type = type;
  reloads[rld_num].hreg = hr;
  return hr;
}